

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O2

DdNode * extraZddTuplesFromBdd(DdManager *dd,DdNode *bVarsK,DdNode *bVarsN)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *T;
  DdNode *data;
  int iVar4;
  
  iVar2 = 0x7fffffff;
  iVar4 = 0x7fffffff;
  if ((ulong)bVarsK->index != 0x7fffffff) {
    iVar4 = dd->perm[bVarsK->index];
  }
  if ((ulong)bVarsN->index != 0x7fffffff) {
    iVar2 = dd->perm[bVarsN->index];
  }
  if (iVar4 < iVar2) {
    return dd->zero;
  }
  if (dd->one == bVarsN) {
    return dd->one;
  }
  pDVar3 = cuddCacheLookup2Zdd(dd,extraZddTuplesFromBdd,bVarsK,bVarsN);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  pDVar3 = extraZddTuplesFromBdd(dd,bVarsK,(bVarsN->type).kids.T);
  if (pDVar3 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (dd->one == bVarsK) {
    T = dd->zero;
  }
  else {
    T = extraZddTuplesFromBdd(dd,(bVarsK->type).kids.T,(bVarsN->type).kids.T);
    if (T == (DdNode *)0x0) goto LAB_00648b4c;
  }
  piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  data = cuddZddGetNode(dd,bVarsN->index * 2,T,pDVar3);
  if (data != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
    piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
    cuddCacheInsert2(dd,extraZddTuplesFromBdd,bVarsK,bVarsN,data);
    return data;
  }
  Cudd_RecursiveDerefZdd(dd,pDVar3);
  pDVar3 = T;
LAB_00648b4c:
  Cudd_RecursiveDerefZdd(dd,pDVar3);
  return (DdNode *)0x0;
}

Assistant:

DdNode* extraZddTuplesFromBdd( 
  DdManager * dd,   /* the DD manager */
  DdNode * bVarsK,   /* the number of variables in tuples */
  DdNode * bVarsN)   /* the set of all variables */
{
    DdNode *zRes, *zRes0, *zRes1;
    statLine(dd); 

    /* terminal cases */
/*  if ( k < 0 || k > n )
 *      return dd->zero;
 *  if ( n == 0 )
 *      return dd->one; 
 */
    if ( cuddI( dd, bVarsK->index ) < cuddI( dd, bVarsN->index ) )
        return z0;
    if ( bVarsN == b1 )
        return z1;

    /* check cache */
    zRes = cuddCacheLookup2Zdd(dd, extraZddTuplesFromBdd, bVarsK, bVarsN);
    if (zRes)
        return(zRes);

    /* ZDD in which this variable is 0 */
/*  zRes0 = extraZddTuplesFromBdd( dd, k,     n-1 ); */
    zRes0 = extraZddTuplesFromBdd( dd, bVarsK, cuddT(bVarsN) );
    if ( zRes0 == NULL ) 
        return NULL;
    cuddRef( zRes0 );

    /* ZDD in which this variable is 1 */
/*  zRes1 = extraZddTuplesFromBdd( dd, k-1,          n-1 ); */
    if ( bVarsK == b1 )
    {
        zRes1 = z0;
        cuddRef( zRes1 );
    }
    else
    {
        zRes1 = extraZddTuplesFromBdd( dd, cuddT(bVarsK), cuddT(bVarsN) );
        if ( zRes1 == NULL ) 
        {
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            return NULL;
        }
        cuddRef( zRes1 );
    }

    /* compose Res0 and Res1 with the given ZDD variable */
    zRes = cuddZddGetNode( dd, 2*bVarsN->index, zRes1, zRes0 );
    if ( zRes == NULL ) 
    {
        Cudd_RecursiveDerefZdd( dd, zRes0 );
        Cudd_RecursiveDerefZdd( dd, zRes1 );
        return NULL;
    }
    cuddDeref( zRes0 );
    cuddDeref( zRes1 );

    /* insert the result into cache */
    cuddCacheInsert2(dd, extraZddTuplesFromBdd, bVarsK, bVarsN, zRes);
    return zRes;

}